

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O0

Aig_Obj_t * Saig_ManRetimeNodeFwd(Aig_Man_t *p,Aig_Obj_t *pObj,int fMakeBug)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  bool local_65;
  int fCompl;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pInput1;
  Aig_Obj_t *pInput0;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  int fMakeBug_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x34,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x35,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  pAVar3 = Aig_ObjFanin0(pObj);
  pAVar4 = Aig_ObjFanin1(pObj);
  iVar1 = Aig_ObjIsCi(pAVar3);
  if ((iVar1 == 0) || (iVar1 = Aig_ObjIsCi(pAVar4), iVar1 == 0)) {
    return (Aig_Obj_t *)0x0;
  }
  iVar1 = Saig_ObjIsLo(p,pAVar3);
  if ((iVar1 != 0) && (iVar1 = Saig_ObjIsLo(p,pAVar4), iVar1 != 0)) {
    iVar1 = Aig_ObjCioId(pAVar3);
    if (iVar1 < 1) {
      __assert_fail("Aig_ObjCioId(pFanin0) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                    ,0x41,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    iVar1 = Aig_ObjCioId(pAVar4);
    if (0 < iVar1) {
      iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar3);
      if ((iVar1 == 0) && (iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar4), iVar1 == 0)) {
        return (Aig_Obj_t *)0x0;
      }
      iVar1 = Aig_ObjCioId(pAVar3);
      iVar2 = Saig_ManPiNum(p);
      pAVar3 = Saig_ManLi(p,iVar1 - iVar2);
      iVar1 = Aig_ObjCioId(pAVar4);
      iVar2 = Saig_ManPiNum(p);
      pAVar4 = Saig_ManLi(p,iVar1 - iVar2);
      pAVar3 = Aig_ObjChild0(pAVar3);
      pAVar4 = Aig_ObjChild0(pAVar4);
      iVar1 = Aig_ObjFaninC0(pObj);
      pAVar3 = Aig_NotCond(pAVar3,iVar1);
      iVar1 = Aig_ObjFaninC1(pObj);
      pObjNew = Aig_NotCond(pAVar4,iVar1);
      iVar1 = Aig_ObjFaninC0(pObj);
      local_65 = false;
      if (iVar1 != 0) {
        iVar1 = Aig_ObjFaninC1(pObj);
        local_65 = iVar1 != 0;
      }
      if (fMakeBug != 0) {
        printf("Introducing bug during retiming.\n");
        pObjNew = Aig_Not(pObjNew);
      }
      pAVar3 = Aig_And(p,pAVar3,pObjNew);
      pAVar3 = Aig_NotCond(pAVar3,(uint)local_65);
      pAVar3 = Aig_ObjCreateCo(p,pAVar3);
      iVar1 = Aig_ManCoNum(p);
      (pAVar3->field_0).CioId = iVar1 + -1;
      pAVar3 = Aig_ObjCreateCi(p);
      iVar1 = Aig_ManCiNum(p);
      (pAVar3->field_0).CioId = iVar1 + -1;
      p->nRegs = p->nRegs + 1;
      Aig_ObjSetTravIdCurrent(p,pAVar3);
      pAVar3 = Aig_NotCond(pAVar3,(uint)local_65);
      return pAVar3;
    }
    __assert_fail("Aig_ObjCioId(pFanin1) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x42,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs one retiming step forward.]

  Description [Returns the pointer to the register output after retiming.]
               
  SideEffects [Remember to run Aig_ManSetCioIds() in advance.]

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Saig_ManRetimeNodeFwd( Aig_Man_t * p, Aig_Obj_t * pObj, int fMakeBug )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    Aig_Obj_t * pInput0, * pInput1;
    Aig_Obj_t * pObjNew, * pObjLi, * pObjLo;
    int fCompl;

    assert( Saig_ManRegNum(p) > 0 );
    assert( Aig_ObjIsNode(pObj) );

    // get the fanins
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);
    // skip of they are not primary inputs
    if ( !Aig_ObjIsCi(pFanin0) || !Aig_ObjIsCi(pFanin1) )
        return NULL;

    // skip of they are not register outputs
    if ( !Saig_ObjIsLo(p, pFanin0) || !Saig_ObjIsLo(p, pFanin1) )
        return NULL;
    assert( Aig_ObjCioId(pFanin0) > 0 );
    assert( Aig_ObjCioId(pFanin1) > 0 );

    // skip latch guns
    if ( !Aig_ObjIsTravIdCurrent(p, pFanin0) && !Aig_ObjIsTravIdCurrent(p, pFanin1) )
        return NULL;

    // get the inputs of these registers
    pInput0 = Saig_ManLi( p, Aig_ObjCioId(pFanin0) - Saig_ManPiNum(p) );
    pInput1 = Saig_ManLi( p, Aig_ObjCioId(pFanin1) - Saig_ManPiNum(p) );
    pInput0 = Aig_ObjChild0( pInput0 );
    pInput1 = Aig_ObjChild0( pInput1 );
    pInput0 = Aig_NotCond( pInput0, Aig_ObjFaninC0(pObj) );
    pInput1 = Aig_NotCond( pInput1, Aig_ObjFaninC1(pObj) );
    // get the condition when the register should be complemetned
    fCompl = Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj);

    if ( fMakeBug )
    {
        printf( "Introducing bug during retiming.\n" );
        pInput1 = Aig_Not( pInput1 );
    }

    // create new node
    pObjNew = Aig_And( p, pInput0, pInput1 );

    // create new register input
    pObjLi = Aig_ObjCreateCo( p, Aig_NotCond(pObjNew, fCompl) );
    pObjLi->CioId = Aig_ManCoNum(p) - 1;

    // create new register output
    pObjLo = Aig_ObjCreateCi( p );
    pObjLo->CioId = Aig_ManCiNum(p) - 1;
    p->nRegs++;

    // make sure the register is retimable.
    Aig_ObjSetTravIdCurrent(p, pObjLo);

//printf( "Reg = %4d. Reg = %4d. Compl = %d. Phase = %d.\n", 
//       pFanin0->PioNum, pFanin1->PioNum, Aig_IsComplement(pObjNew), fCompl );

    // return register output
    return Aig_NotCond( pObjLo, fCompl );
}